

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_x86.c
# Opt level: O0

void print_insn_detail(csh ud,cs_mode mode,cs_insn *ins)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  cs_x86_op *op;
  int index;
  cs_x86 *x86;
  int i;
  int count;
  cs_insn *ins_local;
  cs_mode mode_local;
  csh ud_local;
  
  if (ins->detail != (cs_detail *)0x0) {
    pcVar2 = ins->detail;
    print_string_hex("\tPrefix:",(uchar *)&pcVar2->field_6,4);
    print_string_hex("\tOpcode:",(pcVar2->field_6).x86.opcode,4);
    printf("\trex: 0x%x\n",(ulong)(pcVar2->field_6).x86.rex);
    printf("\taddr_size: %u\n",(ulong)(pcVar2->field_6).x86.addr_size);
    printf("\tmodrm: 0x%x\n",(ulong)(pcVar2->field_6).x86.modrm);
    printf("\tdisp: 0x%x\n",(ulong)(pcVar2->field_6).arm.cps_mode);
    if ((mode & CS_MODE_16) == CS_MODE_ARM) {
      printf("\tsib: 0x%x\n",(ulong)(pcVar2->field_6).x86.sib);
      if ((pcVar2->field_6).x86.sib_base != X86_REG_INVALID) {
        pcVar5 = cs_reg_name(handle,(pcVar2->field_6).x86.sib_base);
        printf("\t\tsib_base: %s\n",pcVar5);
      }
      if ((pcVar2->field_6).x86.sib_index != X86_REG_INVALID) {
        pcVar5 = cs_reg_name(handle,(pcVar2->field_6).x86.sib_index);
        printf("\t\tsib_index: %s\n",pcVar5);
      }
      if ((pcVar2->field_6).x86.sib_scale != '\0') {
        printf("\t\tsib_scale: %d\n",(ulong)(uint)(int)(pcVar2->field_6).x86.sib_scale);
      }
    }
    if ((pcVar2->field_6).x86.sse_cc != X86_SSE_CC_INVALID) {
      printf("\tsse_cc: %u\n",(ulong)(pcVar2->field_6).x86.sse_cc);
    }
    if ((pcVar2->field_6).x86.avx_cc != X86_AVX_CC_INVALID) {
      printf("\tavx_cc: %u\n",(ulong)(pcVar2->field_6).x86.avx_cc);
    }
    if (((pcVar2->field_6).x86.avx_sae & 1U) != 0) {
      printf("\tavx_sae: %u\n",(ulong)((pcVar2->field_6).x86.avx_sae & 1));
    }
    if ((pcVar2->field_6).x86.avx_rm != X86_AVX_RM_INVALID) {
      printf("\tavx_rm: %u\n",(ulong)(pcVar2->field_6).x86.avx_rm);
    }
    uVar3 = cs_op_count(ud,ins,2);
    if (uVar3 != 0) {
      printf("\timm_count: %u\n",(ulong)uVar3);
      for (x86._0_4_ = 1; (int)(uint)x86 < (int)(uVar3 + 1); x86._0_4_ = (uint)x86 + 1) {
        iVar4 = cs_op_index(ud,ins,2,(uint)x86);
        printf("\t\timms[%u]: 0x%lx\n",(ulong)(uint)x86,
               *(undefined8 *)((long)&pcVar2->field_6 + (long)iVar4 * 0x30 + 0x38));
      }
    }
    if ((pcVar2->field_6).x86.op_count != '\0') {
      printf("\top_count: %u\n",(ulong)(pcVar2->field_6).x86.op_count);
    }
    for (x86._0_4_ = 0; (int)(uint)x86 < (int)(uint)(pcVar2->field_6).x86.op_count;
        x86._0_4_ = (uint)x86 + 1) {
      puVar1 = pcVar2->groups + (long)(int)(uint)x86 * 0x30 + 0x3e;
      switch(*(undefined4 *)puVar1) {
      case 1:
        pcVar5 = cs_reg_name(handle,*(uint *)(puVar1 + 8));
        printf("\t\toperands[%u].type: REG = %s\n",(ulong)(uint)x86,pcVar5);
        break;
      case 2:
        printf("\t\toperands[%u].type: IMM = 0x%lx\n",(ulong)(uint)x86,*(undefined8 *)(puVar1 + 8));
        break;
      case 3:
        printf("\t\toperands[%u].type: MEM\n",(ulong)(uint)x86);
        if (*(int *)(puVar1 + 8) != 0) {
          pcVar5 = cs_reg_name(handle,*(uint *)(puVar1 + 8));
          printf("\t\t\toperands[%u].mem.segment: REG = %s\n",(ulong)(uint)x86,pcVar5);
        }
        if (*(int *)(puVar1 + 0xc) != 0) {
          pcVar5 = cs_reg_name(handle,*(uint *)(puVar1 + 0xc));
          printf("\t\t\toperands[%u].mem.base: REG = %s\n",(ulong)(uint)x86,pcVar5);
        }
        if (*(int *)(puVar1 + 0x10) != 0) {
          pcVar5 = cs_reg_name(handle,*(uint *)(puVar1 + 0x10));
          printf("\t\t\toperands[%u].mem.index: REG = %s\n",(ulong)(uint)x86,pcVar5);
        }
        if (*(int *)(puVar1 + 0x14) != 1) {
          printf("\t\t\toperands[%u].mem.scale: %u\n",(ulong)(uint)x86,
                 (ulong)*(uint *)(puVar1 + 0x14));
        }
        if (*(long *)(puVar1 + 0x18) != 0) {
          printf("\t\t\toperands[%u].mem.disp: 0x%lx\n",(ulong)(uint)x86,
                 *(undefined8 *)(puVar1 + 0x18));
        }
        break;
      case 4:
        printf("\t\toperands[%u].type: FP = %f\n",*(undefined8 *)(puVar1 + 8),(ulong)(uint)x86);
      }
      if (*(int *)(puVar1 + 0x24) != 0) {
        printf("\t\toperands[%u].avx_bcast: %u\n",(ulong)(uint)x86,(ulong)*(uint *)(puVar1 + 0x24));
      }
      if ((puVar1[0x28] & 1) != 0) {
        printf("\t\toperands[%u].avx_zero_opmask: TRUE\n",(ulong)(uint)x86);
      }
      printf("\t\toperands[%u].size: %u\n",(ulong)(uint)x86,(ulong)puVar1[0x20]);
    }
    printf("\n");
  }
  return;
}

Assistant:

static void print_insn_detail(csh ud, cs_mode mode, cs_insn *ins)
{
	int count, i;
	cs_x86 *x86;

	// detail can be NULL on "data" instruction if SKIPDATA option is turned ON
	if (ins->detail == NULL)
		return;

	x86 = &(ins->detail->x86);

	print_string_hex("\tPrefix:", x86->prefix, 4);

	print_string_hex("\tOpcode:", x86->opcode, 4);

	printf("\trex: 0x%x\n", x86->rex);

	printf("\taddr_size: %u\n", x86->addr_size);
	printf("\tmodrm: 0x%x\n", x86->modrm);
	printf("\tdisp: 0x%x\n", x86->disp);

	// SIB is not available in 16-bit mode
	if ((mode & CS_MODE_16) == 0) {
		printf("\tsib: 0x%x\n", x86->sib);
		if (x86->sib_base != X86_REG_INVALID)
			printf("\t\tsib_base: %s\n", cs_reg_name(handle, x86->sib_base));
		if (x86->sib_index != X86_REG_INVALID)
			printf("\t\tsib_index: %s\n", cs_reg_name(handle, x86->sib_index));
		if (x86->sib_scale != 0)
			printf("\t\tsib_scale: %d\n", x86->sib_scale);
	}

	// SSE code condition
	if (x86->sse_cc != X86_SSE_CC_INVALID) {
		printf("\tsse_cc: %u\n", x86->sse_cc);
	}

	// AVX code condition
	if (x86->avx_cc != X86_AVX_CC_INVALID) {
		printf("\tavx_cc: %u\n", x86->avx_cc);
	}

	// AVX Suppress All Exception
	if (x86->avx_sae) {
		printf("\tavx_sae: %u\n", x86->avx_sae);
	}

	// AVX Rounding Mode
	if (x86->avx_rm != X86_AVX_RM_INVALID) {
		printf("\tavx_rm: %u\n", x86->avx_rm);
	}

	count = cs_op_count(ud, ins, X86_OP_IMM);
	if (count) {
		printf("\timm_count: %u\n", count);
		for (i = 1; i < count + 1; i++) {
			int index = cs_op_index(ud, ins, X86_OP_IMM, i);
			printf("\t\timms[%u]: 0x%"PRIx64 "\n", i, x86->operands[index].imm);
		}
	}

	if (x86->op_count)
		printf("\top_count: %u\n", x86->op_count);
	for (i = 0; i < x86->op_count; i++) {
		cs_x86_op *op = &(x86->operands[i]);

		switch((int)op->type) {
			case X86_OP_REG:
				printf("\t\toperands[%u].type: REG = %s\n", i, cs_reg_name(handle, op->reg));
				break;
			case X86_OP_IMM:
				printf("\t\toperands[%u].type: IMM = 0x%"PRIx64 "\n", i, op->imm);
				break;
			case X86_OP_FP:
				printf("\t\toperands[%u].type: FP = %f\n", i, op->fp);
				break;
			case X86_OP_MEM:
				printf("\t\toperands[%u].type: MEM\n", i);
				if (op->mem.segment != X86_REG_INVALID)
					printf("\t\t\toperands[%u].mem.segment: REG = %s\n", i, cs_reg_name(handle, op->mem.segment));
				if (op->mem.base != X86_REG_INVALID)
					printf("\t\t\toperands[%u].mem.base: REG = %s\n", i, cs_reg_name(handle, op->mem.base));
				if (op->mem.index != X86_REG_INVALID)
					printf("\t\t\toperands[%u].mem.index: REG = %s\n", i, cs_reg_name(handle, op->mem.index));
				if (op->mem.scale != 1)
					printf("\t\t\toperands[%u].mem.scale: %u\n", i, op->mem.scale);
				if (op->mem.disp != 0)
					printf("\t\t\toperands[%u].mem.disp: 0x%" PRIx64 "\n", i, op->mem.disp);
				break;
			default:
				break;
		}

		// AVX broadcast type
		if (op->avx_bcast != X86_AVX_BCAST_INVALID)
			printf("\t\toperands[%u].avx_bcast: %u\n", i, op->avx_bcast);

		// AVX zero opmask {z}
		if (op->avx_zero_opmask != false)
			printf("\t\toperands[%u].avx_zero_opmask: TRUE\n", i);

		printf("\t\toperands[%u].size: %u\n", i, op->size);
	}

	printf("\n");
}